

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushPopTest.cpp
# Opt level: O2

void __thiscall
PushPopTest_RandomOrder_Test::~PushPopTest_RandomOrder_Test(PushPopTest_RandomOrder_Test *this)

{
  ~PushPopTest_RandomOrder_Test
            ((PushPopTest_RandomOrder_Test *)
             &this[-1].super_PushPopTest.stdDeque.super__Deque_base<int,_std::allocator<int>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_last);
  return;
}

Assistant:

TEST_P(PushPopTest, RandomOrder) {
    std::size_t n = GetParam();

    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        myDeque.push_back(x);
        stdDeque.push_back(x);
        int y = nextRandom();
        myDeque.push_front(y);
        stdDeque.push_front(y);
    }

    ASSERT_EQ(myDeque.size(), stdDeque.size());

    while (!stdDeque.empty()) {
        int s = stdDeque.back();
        int m = myDeque.back();
        ASSERT_EQ(s, m);
        stdDeque.pop_back();
        myDeque.pop_back();
    }
}